

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_indirect_string.cpp
# Opt level: O1

void __thiscall
IndirectStringAdder_NewString_Test::TestBody(IndirectStringAdder_NewString_Test *this)

{
  anon_union_8_2_d34ab9e4_for_indirect_string_3 this_00;
  indirect_string *piVar1;
  database *db;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  size_type *psVar3;
  shared_sstring_view res1_owner;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  name_index;
  mock_mutex mutex;
  raw_sstring_view sstring1;
  indirect_string_adder adder;
  raw_sstring_view sstring2;
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  res1;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  AssertHelper local_2f0;
  undefined1 local_2e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2e0;
  size_type local_2d8;
  undefined1 local_2c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  anon_union_8_2_d34ab9e4_for_indirect_string_3 local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  raw_sstring_view local_298;
  AssertHelper local_288;
  undefined1 local_279;
  sstring_view<const_char_*> local_278;
  indirect_string_adder local_268;
  sstring_view<const_char_*> local_250;
  undefined1 local_240 [8];
  index_pointer local_238 [28];
  _Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
  local_158;
  bool local_150;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_148;
  not_null<const_pstore::sstring_view<const_char_*>_*> local_140;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_138;
  not_null<const_pstore::sstring_view<const_char_*>_*> local_130;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_128;
  not_null<const_pstore::sstring_view<const_char_*>_*> local_120;
  transaction<std::unique_lock<mock_mutex>_> local_118 [4];
  size_type *local_38;
  void *local_30;
  
  db = &(this->super_IndirectStringAdder).db_;
  local_240 = (undefined1  [8])&local_279;
  local_238[0].addr_.a_._0_1_ = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_240);
  local_238[0].addr_.a_._0_1_ = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (local_118,db,(unique_lock<mock_mutex> *)local_240);
  if (((bool)local_238[0]._0_1_ == true) && (local_240 != (undefined1  [8])0x0)) {
    local_238[0].addr_.a_._0_1_ = false;
  }
  pstore::index::
  get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((index *)&local_298,db,true);
  local_268.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_268.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278 = pstore::make_sstring_view("string");
  local_250 = pstore::make_sstring_view("string");
  local_120.ptr_ = &local_278;
  pstore::gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::ensure_invariant(&local_120);
  pstore::indirect_string_adder::
  add<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
              *)local_240,&local_268,&local_118[0].super_transaction_base,
             (shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
              *)&local_298,local_120);
  local_2e8 = (undefined1  [8])0x0;
  _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2d8 = 0;
  piVar1 = &pstore::index::
            hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
            ::iterator_base<true>::operator*((iterator_base<true> *)local_240)->first;
  local_128.ptr_ = (sstring_view<std::shared_ptr<const_char>_> *)local_2e8;
  pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant
            (&local_128);
  _local_2c8 = pstore::indirect_string::as_string_view(piVar1,local_128);
  testing::internal::
  CmpHelperEQ<pstore::sstring_view<char_const*>,pstore::sstring_view<char_const*>>
            ((internal *)&local_2b8,"res1.first->as_string_view (&res1_owner)","sstring1",
             (sstring_view<const_char_*> *)local_2c8,&local_278);
  if (local_2b8.address_._0_1_ == '\0') {
    testing::Message::Message((Message *)local_2c8);
    if (local_2b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_2b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xda,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_2c8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_2c8 + 8))();
    }
  }
  if (local_2b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2b0,local_2b0);
  }
  local_2c8[0] = local_150;
  local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150 == false) {
    testing::Message::Message((Message *)&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_2b8,(internal *)local_2c8,(AssertionResult *)"res1.second","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xdb,(char *)local_2b8.str_);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.address_ != &local_2a8) {
      operator_delete(local_2b8.str_,local_2a8._M_allocated_capacity + 1);
    }
    if (local_2f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f0.data_ + 8))();
    }
  }
  if (local_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2c8 + 8),local_2c0);
  }
  if (_Stack_2e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2e0._M_pi);
  }
  if (local_158._M_head_impl !=
      (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0) {
    operator_delete(local_158._M_head_impl,0x20);
  }
  local_130.ptr_ = &local_250;
  pstore::gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::ensure_invariant(&local_130);
  pstore::indirect_string_adder::
  add<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
              *)local_240,&local_268,&local_118[0].super_transaction_base,
             (shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
              *)&local_298,local_130);
  local_2e8 = (undefined1  [8])0x0;
  _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2d8 = 0;
  piVar1 = &pstore::index::
            hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
            ::iterator_base<true>::operator*((iterator_base<true> *)local_240)->first;
  local_138.ptr_ = (sstring_view<std::shared_ptr<const_char>_> *)local_2e8;
  pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant
            (&local_138);
  _local_2c8 = pstore::indirect_string::as_string_view(piVar1,local_138);
  testing::internal::
  CmpHelperEQ<pstore::sstring_view<char_const*>,pstore::sstring_view<char_const*>>
            ((internal *)&local_2b8,"res2.first->as_string_view (&res2_owner)","sstring1",
             (sstring_view<const_char_*> *)local_2c8,&local_278);
  if (local_2b8.address_._0_1_ == '\0') {
    testing::Message::Message((Message *)local_2c8);
    if (local_2b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_2b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xe3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_2c8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_2c8 + 8))();
    }
  }
  if (local_2b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2b0,local_2b0);
  }
  local_2c8[0] = local_150 ^ 1;
  local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150 != false) {
    testing::Message::Message((Message *)&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_2b8,(internal *)local_2c8,(AssertionResult *)"res2.second","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xe4,(char *)local_2b8.str_);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.address_ != &local_2a8) {
      operator_delete(local_2b8.str_,local_2a8._M_allocated_capacity + 1);
    }
    if (local_2f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f0.data_ + 8))();
    }
  }
  if (local_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2c8 + 8),local_2c0);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_2e0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2e0._M_pi);
  }
  if (local_158._M_head_impl !=
      (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0) {
    operator_delete(local_158._M_head_impl,0x20);
  }
  local_2b8 = (anon_union_8_2_d34ab9e4_for_indirect_string_3)
              local_118[0].super_transaction_base.size_;
  local_2e8 = (undefined1  [8])&DAT_00000008;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_240,"transaction.size ()","sizeof (pstore::address)",
             &local_2b8.address_,(unsigned_long *)local_2e8);
  if (local_240[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2b8);
    if ((undefined8 *)CONCAT71(local_238[0].addr_.a_._1_7_,(undefined1)local_238[0].addr_.a_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(local_238[0].addr_.a_._1_7_,(undefined1)local_238[0].addr_.a_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xe6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2e8,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
    if ((void *)local_2b8.address_ != (void *)0x0) {
      (**(code **)((local_2b8.str_)->ptr_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(local_238[0].addr_.a_._1_7_,(undefined1)local_238[0].addr_.a_) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_240 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_238[0].addr_.a_._1_7_,(undefined1)local_238[0].addr_.a_));
  }
  pstore::indirect_string_adder::flush(&local_268,&local_118[0].super_transaction_base);
  if (local_268.views_.
      super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.views_.
                    super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.views_.
                          super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.views_.
                          super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.size_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.size_);
  }
  pstore::transaction_base::commit(&local_118[0].super_transaction_base);
  local_118[0].super_transaction_base._vptr_transaction_base =
       (_func_int **)&PTR__transaction_00271290;
  pstore::transaction_base::rollback(&local_118[0].super_transaction_base);
  if ((local_118[0].lock_._M_owns == true) && (local_118[0].lock_._M_device != (mutex_type *)0x0)) {
    local_118[0].lock_._M_owns = false;
  }
  pstore::index::
  get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((index *)&local_2b8,db,true);
  local_268.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = pstore::make_sstring_view("string");
  this_00 = local_2b8;
  local_140.ptr_ = (sstring_view<const_char_*> *)&local_268;
  pstore::gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::ensure_invariant(&local_140);
  pstore::indirect_string::indirect_string((indirect_string *)local_118,db,local_140);
  pstore::index::
  hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
  ::find<pstore::indirect_string,void>
            ((const_iterator *)local_240,this_00.str_,db,(indirect_string *)local_118);
  psVar3 = &(local_2b8.str_)->size_;
  memset(&local_118[0].super_transaction_base.db_,0,0xd8);
  local_30 = (void *)0x0;
  local_118[0].super_transaction_base._vptr_transaction_base = (_func_int **)db;
  local_38 = psVar3;
  testing::internal::
  CmpHelperNE<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>::iterator_base<true>>,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>::iterator_base<true>>>
            ((internal *)local_2e8,"pos","name_index->cend (db_)",
             (set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
              *)local_240,
             (set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
              *)local_118);
  if (local_30 != (void *)0x0) {
    operator_delete(local_30,0x20);
  }
  if (local_2e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_118);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_2e0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&(_Stack_2e0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((database *)local_118[0].super_transaction_base._vptr_transaction_base != (database *)0x0) {
      (*(*(_func_int ***)local_118[0].super_transaction_base._vptr_transaction_base)[1])();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_2e0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_2e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_2e0._M_pi);
    }
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_2e0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_2e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_2e0._M_pi);
    }
    local_118[0].super_transaction_base._vptr_transaction_base = (_func_int **)0x0;
    local_118[0].super_transaction_base.db_ = (database *)0x0;
    local_118[0].super_transaction_base.size_ = 0;
    piVar1 = &pstore::index::
              hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
              ::iterator_base<true>::operator*((iterator_base<true> *)local_240)->first;
    local_148.ptr_ = (sstring_view<std::shared_ptr<const_char>_> *)local_118;
    pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant
              (&local_148);
    local_298 = pstore::indirect_string::as_string_view(piVar1,local_148);
    local_278 = pstore::make_sstring_view("string");
    testing::internal::
    CmpHelperEQ<pstore::sstring_view<char_const*>,pstore::sstring_view<char_const*>>
              ((internal *)local_2e8,"pos->as_string_view (&owner)",
               "pstore::make_sstring_view (str)",&local_298,&local_278);
    if (local_2e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_298);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_2e0._M_pi ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((_Alloc_hider *)&(_Stack_2e0._M_pi)->_vptr__Sp_counted_base)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
                 ,0xf2,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_298);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
      if ((long *)local_298.ptr_ != (long *)0x0) {
        (**(code **)(*(long *)local_298.ptr_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_2e0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_2e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_2e0._M_pi);
    }
    if (local_118[0].super_transaction_base.db_ != (database *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_118[0].super_transaction_base.db_);
    }
  }
  if ((_Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
       )local_158._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
       )0x0) {
    operator_delete(local_158._M_head_impl,0x20);
  }
  if (local_2b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0);
  }
  return;
}

Assistant:

TEST_F (IndirectStringAdder, NewString) {
    constexpr auto str = "string";
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        {
            auto const name_index = pstore::index::get_index<pstore::trailer::indices::name> (db_);

            // Use the string adder to insert a string into the index and flush it to the store.
            pstore::indirect_string_adder adder;
            auto const sstring1 = pstore::make_sstring_view (str);
            auto const sstring2 = pstore::make_sstring_view (str);
            {
                std::pair<pstore::index::name_index::iterator, bool> res1 =
                    adder.add (transaction, name_index, &sstring1);
                pstore::shared_sstring_view res1_owner;
                EXPECT_EQ (res1.first->as_string_view (&res1_owner), sstring1);
                EXPECT_TRUE (res1.second);
            }
            {
                // adding the same string again should result in nothing being written.
                std::pair<pstore::index::name_index::iterator, bool> const res2 =
                    adder.add (transaction, name_index, &sstring2);

                pstore::shared_sstring_view res2_owner;
                EXPECT_EQ (res2.first->as_string_view (&res2_owner), sstring1);
                EXPECT_FALSE (res2.second);
            }
            EXPECT_EQ (transaction.size (), sizeof (pstore::address));
            adder.flush (transaction);
        }
        transaction.commit ();
    }
    {
        auto const name_index = pstore::index::get_index<pstore::trailer::indices::name> (db_);
        auto const sstring = pstore::make_sstring_view (str);
        auto const pos = name_index->find (db_, pstore::indirect_string{db_, &sstring});
        ASSERT_NE (pos, name_index->cend (db_));

        pstore::shared_sstring_view owner;
        EXPECT_EQ (pos->as_string_view (&owner), pstore::make_sstring_view (str));
    }
}